

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::mat4::homogeneous::tile
                 (mat4 *__return_storage_ptr__,float_t left,float_t right,float_t bottom,float_t top
                 )

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float_t ty;
  float_t tx;
  float_t d2;
  float_t d1;
  float_t c2;
  float_t c1;
  float_t top_local;
  float_t bottom_local;
  float_t right_local;
  float_t left_local;
  
  bVar1 = false;
  if ((left != right) || (NAN(left) || NAN(right))) {
    bVar1 = bottom != top;
  }
  if (bVar1) {
    fVar2 = 1.0 / (right - left);
    fVar3 = 1.0 / (top - bottom);
    mat4(__return_storage_ptr__,fVar2 * 2.0,0.0,0.0,-(right + left) * fVar2,0.0,fVar3 * 2.0,0.0,
         -(top + bottom) * fVar3,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
    return __return_storage_ptr__;
  }
  __assert_fail("left != right && bottom != top",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_algebra/dj_algebra.h"
                ,0x379,
                "static mat4 dja::mat4::homogeneous::tile(float_t, float_t, float_t, float_t)");
}

Assistant:

mat4
mat4::homogeneous::tile(
    float_t left, float_t right,
    float_t bottom, float_t top
) {
    DJA_ASSERT(left != right && bottom != top);
    float_t c1 = float_t(1) / (right - left);
    float_t c2 = float_t(1) / (top - bottom);
    float_t d1 = float_t(2) * c1;
    float_t d2 = float_t(2) * c2;
    float_t tx = -(right + left) * c1;
    float_t ty = -(top + bottom) * c2;

    return mat4(d1, 0 , 0, tx,
                0 , d2, 0, ty,
                0 , 0 , 1,  0,
                0 , 0 , 0,  1);
}